

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

bool operator==(CECoordinates *lhs,CECoordinates *rhs)

{
  CECoordinateType CVar1;
  CECoordinateType CVar2;
  CECoordinates *in_RSI;
  CECoordinates *in_RDI;
  double dVar3;
  double marcsec_rad;
  CEAngle angsep;
  bool are_equal;
  CECoordinates *in_stack_000000c0;
  CECoordinates *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffffa0;
  CEAngle local_40;
  double *local_30;
  CEAngle local_28;
  byte local_11;
  CECoordinates *local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  CVar1 = CECoordinates::GetCoordSystem(in_RDI);
  CVar2 = CECoordinates::GetCoordSystem(local_10);
  if (CVar1 == CVar2) {
    CECoordinates::AngularSeparation(in_stack_000000c8,in_stack_000000c0);
    local_30 = (double *)CEAngle::operator_cast_to_double(&local_40);
    CEAngle::CEAngle((CEAngle *)CONCAT44(CVar1,in_stack_ffffffffffffffa0),local_30);
    CEAngle::~CEAngle((CEAngle *)0x12d6b1);
    dVar3 = CEAngle::operator_cast_to_double(&local_28);
    if (1.4544e-05 < dVar3) {
      local_11 = 0;
    }
    CEAngle::~CEAngle((CEAngle *)0x12d72f);
  }
  else {
    local_11 = 0;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool operator==(const CECoordinates& lhs, const CECoordinates& rhs)
{
    bool are_equal = true;
    
    // Check the coordinate systems are equivalent
    if (lhs.GetCoordSystem() != rhs.GetCoordSystem()) {
        are_equal = false;
    }
    // Check that the x-coordinate and the y-coordinate are the same
    else {
        // Check how far appart the coordinates are from each other
        CEAngle angsep = CECoordinates::AngularSeparation(lhs, rhs);
        // Currently require separation < 0.03 arcsec
        double marcsec_rad = 4.848e-6;
        if (angsep > 3.0*marcsec_rad) {
            are_equal = false;
        }
    }

    return are_equal;
}